

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O3

REF_STATUS
ref_grid_tri_qua_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,REF_INT **g2l,
          REF_INT **l2g)

{
  uint uVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  undefined1 auVar5 [16];
  REF_STATUS RVar6;
  REF_INT *pRVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  char *pcVar11;
  REF_INT cell;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  long lVar15;
  
  pRVar2 = ref_grid->node;
  uVar1 = pRVar2->max;
  if ((long)(int)uVar1 < 0) {
    pcVar11 = "malloc *g2l of REF_INT negative";
    uVar9 = 0x18a;
LAB_00150d7c:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar9,
           "ref_grid_tri_qua_id_nodes",pcVar11);
    RVar6 = 1;
  }
  else {
    pRVar7 = (REF_INT *)malloc((long)(int)uVar1 * 4);
    *g2l = pRVar7;
    auVar5 = _DAT_002168d0;
    if (pRVar7 == (REF_INT *)0x0) {
      pcVar11 = "malloc *g2l of REF_INT NULL";
      uVar9 = 0x18a;
    }
    else {
      if (uVar1 != 0) {
        lVar8 = (ulong)uVar1 - 1;
        auVar13._8_4_ = (int)lVar8;
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
        lVar8 = 0;
        auVar13 = auVar13 ^ _DAT_002168d0;
        auVar14 = _DAT_002168b0;
        auVar16 = _DAT_002168c0;
        do {
          auVar17 = auVar16 ^ auVar5;
          iVar12 = auVar13._4_4_;
          if ((bool)(~(auVar17._4_4_ == iVar12 && auVar13._0_4_ < auVar17._0_4_ ||
                      iVar12 < auVar17._4_4_) & 1)) {
            *(undefined4 *)((long)pRVar7 + lVar8) = 0xffffffff;
          }
          if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
              auVar17._12_4_ <= auVar13._12_4_) {
            *(undefined4 *)((long)pRVar7 + lVar8 + 4) = 0xffffffff;
          }
          auVar17 = auVar14 ^ auVar5;
          iVar10 = auVar17._4_4_;
          if (iVar10 <= iVar12 && (iVar10 != iVar12 || auVar17._0_4_ <= auVar13._0_4_)) {
            *(undefined4 *)((long)pRVar7 + lVar8 + 8) = 0xffffffff;
            *(undefined4 *)((long)pRVar7 + lVar8 + 0xc) = 0xffffffff;
          }
          lVar15 = auVar16._8_8_;
          auVar16._0_8_ = auVar16._0_8_ + 4;
          auVar16._8_8_ = lVar15 + 4;
          lVar15 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 4;
          auVar14._8_8_ = lVar15 + 4;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar8);
      }
      iVar12 = 0;
      *nnode = 0;
      *ncell = 0;
      pRVar3 = ref_grid->cell[3];
      if (0 < pRVar3->max) {
        do {
          RVar6 = ref_cell_nodes(pRVar3,iVar12,local_a8);
          if ((RVar6 == 0) && (local_a8[pRVar3->node_per] == cell_id)) {
            *ncell = *ncell + 1;
            iVar10 = pRVar3->node_per;
            if (0 < iVar10) {
              pRVar7 = *g2l;
              lVar8 = 0;
              do {
                if (pRVar7[local_a8[lVar8]] == -1) {
                  iVar10 = *nnode;
                  pRVar7[local_a8[lVar8]] = iVar10;
                  *nnode = iVar10 + 1;
                  iVar10 = pRVar3->node_per;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar10);
            }
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 < pRVar3->max);
      }
      pRVar3 = ref_grid->cell[6];
      if (0 < pRVar3->max) {
        cell = 0;
        do {
          RVar6 = ref_cell_nodes(pRVar3,cell,local_a8);
          if ((RVar6 == 0) && (local_a8[pRVar3->node_per] == cell_id)) {
            *ncell = *ncell + 1;
            iVar12 = pRVar3->node_per;
            if (0 < iVar12) {
              pRVar7 = *g2l;
              lVar8 = 0;
              do {
                if (pRVar7[local_a8[lVar8]] == -1) {
                  iVar12 = *nnode;
                  pRVar7[local_a8[lVar8]] = iVar12;
                  *nnode = iVar12 + 1;
                  iVar12 = pRVar3->node_per;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar12);
            }
          }
          cell = cell + 1;
        } while (cell < pRVar3->max);
      }
      if ((long)*nnode < 0) {
        pcVar11 = "malloc *l2g of REF_INT negative";
        uVar9 = 0x1a9;
        goto LAB_00150d7c;
      }
      pRVar7 = (REF_INT *)malloc((long)*nnode << 2);
      *l2g = pRVar7;
      if (pRVar7 != (REF_INT *)0x0) {
        *nnode = 0;
        iVar12 = pRVar2->max;
        if (0 < iVar12) {
          pRVar4 = *g2l;
          iVar10 = 0;
          lVar8 = 0;
          do {
            if (pRVar4[lVar8] != -1) {
              pRVar4[lVar8] = iVar10;
              iVar10 = *nnode;
              pRVar7[iVar10] = (REF_INT)lVar8;
              iVar10 = iVar10 + 1;
              *nnode = iVar10;
              iVar12 = pRVar2->max;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < iVar12);
        }
        return 0;
      }
      pcVar11 = "malloc *l2g of REF_INT NULL";
      uVar9 = 0x1a9;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",uVar9,
           "ref_grid_tri_qua_id_nodes",pcVar11);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tri_qua_id_nodes(REF_GRID ref_grid, REF_INT cell_id,
                                             REF_INT *nnode, REF_INT *ncell,
                                             REF_INT **g2l, REF_INT **l2g) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}